

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O0

natwm_error string_to_boolean(char *string,_Bool *result)

{
  _Bool _Var1;
  _Bool local_21;
  _Bool boolean;
  _Bool *result_local;
  char *string_local;
  
  _Var1 = string_no_case_compare(string,"true");
  if (_Var1) {
    local_21 = true;
  }
  else {
    _Var1 = string_no_case_compare(string,"false");
    if (!_Var1) {
      return INVALID_INPUT_ERROR;
    }
    local_21 = false;
  }
  *result = local_21;
  return NO_ERROR;
}

Assistant:

enum natwm_error string_to_boolean(const char *string, bool *result)
{
        bool boolean = false;

        if (string_no_case_compare(string, "true")) {
                boolean = true;
        } else if (string_no_case_compare(string, "false")) {
                boolean = false;
        } else {
                return INVALID_INPUT_ERROR;
        }

        *result = boolean;

        return NO_ERROR;
}